

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O2

void integer_suite::test_lowest(void)

{
  char cVar1;
  short sVar2;
  char value;
  undefined3 uStack_2fb;
  long local_2f8;
  int value_2;
  undefined4 uStack_2ec;
  __string_type input;
  ostringstream stream;
  undefined8 local_2c0 [46];
  decoder_type decoder;
  
  _value = CONCAT31(uStack_2fb,0x80);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&stream);
  *(undefined8 *)((long)local_2c0 + *(long *)(_stream + -0x18)) = 0;
  std::ostream::operator<<((ostringstream *)&stream,-0x80);
  std::__cxx11::stringbuf::str();
  trial::protocol::json::detail::basic_decoder<char>::basic_decoder
            (&decoder,input._M_dataplus._M_p,input._M_dataplus._M_p + input._M_string_length);
  _value_2 = CONCAT44(uStack_2ec,decoder.current.code);
  local_2f8._0_4_ = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1ba,"void integer_suite::test_lowest()",&value_2,&local_2f8);
  cVar1 = trial::protocol::json::detail::basic_decoder<char>::signed_value<signed_char>(&decoder);
  _value_2 = CONCAT71(stack0xfffffffffffffd11,cVar1);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,signed_char,signed_char>
            ("decoder.signed_value<integer_type>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1bb,"void integer_suite::test_lowest()",&value_2,&value);
  trial::protocol::json::detail::basic_decoder<char>::next(&decoder);
  local_2f8._0_4_ = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1bd,"void integer_suite::test_lowest()",&value_2,&local_2f8);
  std::__cxx11::string::~string((string *)&input);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stream);
  _value = CONCAT22(uStack_2fb._1_2_,0x8000);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&stream);
  *(undefined8 *)((long)local_2c0 + *(long *)(_stream + -0x18)) = 0;
  std::ostream::operator<<((ostringstream *)&stream,_value);
  std::__cxx11::stringbuf::str();
  trial::protocol::json::detail::basic_decoder<char>::basic_decoder
            (&decoder,input._M_dataplus._M_p,input._M_dataplus._M_p + input._M_string_length);
  _value_2 = CONCAT44(uStack_2ec,decoder.current.code);
  local_2f8._0_4_ = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1c7,"void integer_suite::test_lowest()",&value_2,&local_2f8);
  sVar2 = trial::protocol::json::detail::basic_decoder<char>::signed_value<short>(&decoder);
  _value_2 = CONCAT62(stack0xfffffffffffffd12,sVar2);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,short,short>
            ("decoder.signed_value<integer_type>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1c8,"void integer_suite::test_lowest()",&value_2,&value);
  trial::protocol::json::detail::basic_decoder<char>::next(&decoder);
  local_2f8._0_4_ = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1ca,"void integer_suite::test_lowest()",&value_2,&local_2f8);
  std::__cxx11::string::~string((string *)&input);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stream);
  _value_2 = CONCAT44(uStack_2ec,0x80000000);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&stream);
  *(undefined8 *)((long)local_2c0 + *(long *)(_stream + -0x18)) = 0;
  std::ostream::operator<<((ostringstream *)&stream,value_2);
  std::__cxx11::stringbuf::str();
  trial::protocol::json::detail::basic_decoder<char>::basic_decoder
            (&decoder,input._M_dataplus._M_p,input._M_dataplus._M_p + input._M_string_length);
  _value = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1d4,"void integer_suite::test_lowest()",&local_2f8,&value);
  local_2f8._0_4_ = trial::protocol::json::detail::basic_decoder<char>::signed_value<int>(&decoder);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,int,int>
            ("decoder.signed_value<integer_type>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1d5,"void integer_suite::test_lowest()",&local_2f8,&value_2);
  trial::protocol::json::detail::basic_decoder<char>::next(&decoder);
  _value = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1d7,"void integer_suite::test_lowest()",&local_2f8,&value);
  std::__cxx11::string::~string((string *)&input);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stream);
  _value_2 = 0x8000000000000000;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&stream);
  *(undefined8 *)((long)local_2c0 + *(long *)(_stream + -0x18)) = 0;
  std::ostream::_M_insert<long>((long)&stream);
  std::__cxx11::stringbuf::str();
  trial::protocol::json::detail::basic_decoder<char>::basic_decoder
            (&decoder,input._M_dataplus._M_p,input._M_dataplus._M_p + input._M_string_length);
  local_2f8 = CONCAT44(local_2f8._4_4_,decoder.current.code);
  _value = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1e1,"void integer_suite::test_lowest()",&local_2f8,&value);
  local_2f8 = trial::protocol::json::detail::basic_decoder<char>::signed_value<long>(&decoder);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,long>
            ("decoder.signed_value<integer_type>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1e2,"void integer_suite::test_lowest()",&local_2f8,&value_2);
  trial::protocol::json::detail::basic_decoder<char>::next(&decoder);
  _value = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1e4,"void integer_suite::test_lowest()",&local_2f8,&value);
  std::__cxx11::string::~string((string *)&input);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stream);
  _value_2 = 0x8000000000000000;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&stream);
  *(undefined8 *)((long)local_2c0 + *(long *)(_stream + -0x18)) = 0;
  std::ostream::_M_insert<long_long>((longlong)&stream);
  std::__cxx11::stringbuf::str();
  trial::protocol::json::detail::basic_decoder<char>::basic_decoder
            (&decoder,input._M_dataplus._M_p,input._M_dataplus._M_p + input._M_string_length);
  local_2f8 = CONCAT44(local_2f8._4_4_,decoder.current.code);
  _value = 8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::integer",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1ee,"void integer_suite::test_lowest()",&local_2f8,&value);
  local_2f8 = trial::protocol::json::detail::basic_decoder<char>::signed_value<long_long>(&decoder);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long_long,long_long>
            ("decoder.signed_value<integer_type>()","value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1ef,"void integer_suite::test_lowest()",&local_2f8,&value_2);
  trial::protocol::json::detail::basic_decoder<char>::next(&decoder);
  local_2f8 = CONCAT44(local_2f8._4_4_,decoder.current.code);
  _value = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x1f1,"void integer_suite::test_lowest()",&local_2f8,&value);
  std::__cxx11::string::~string((string *)&input);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&stream);
  return;
}

Assistant:

void test_lowest()
{
    {
        using integer_type = signed char;
        auto value = std::numeric_limits<integer_type>::lowest();
        std::ostringstream stream;
        stream.precision(std::numeric_limits<integer_type>::max_digits10);
        stream << signed(value);
        auto input = stream.str();
        decoder_type decoder(input.data(), input.size());
        TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::integer);
        TRIAL_PROTOCOL_TEST_EQUAL(decoder.signed_value<integer_type>(), value);
        decoder.next();
        TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
    }
    {
        using integer_type = signed short int;
        auto value = std::numeric_limits<integer_type>::lowest();
        std::ostringstream stream;
        stream.precision(std::numeric_limits<integer_type>::max_digits10);
        stream << value;
        auto input = stream.str();
        decoder_type decoder(input.data(), input.size());
        TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::integer);
        TRIAL_PROTOCOL_TEST_EQUAL(decoder.signed_value<integer_type>(), value);
        decoder.next();
        TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
    }
    {
        using integer_type = signed int;
        auto value = std::numeric_limits<integer_type>::lowest();
        std::ostringstream stream;
        stream.precision(std::numeric_limits<integer_type>::max_digits10);
        stream << value;
        auto input = stream.str();
        decoder_type decoder(input.data(), input.size());
        TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::integer);
        TRIAL_PROTOCOL_TEST_EQUAL(decoder.signed_value<integer_type>(), value);
        decoder.next();
        TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
    }
    {
        using integer_type = signed long int;
        auto value = std::numeric_limits<integer_type>::lowest();
        std::ostringstream stream;
        stream.precision(std::numeric_limits<integer_type>::max_digits10);
        stream << value;
        auto input = stream.str();
        decoder_type decoder(input.data(), input.size());
        TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::integer);
        TRIAL_PROTOCOL_TEST_EQUAL(decoder.signed_value<integer_type>(), value);
        decoder.next();
        TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
    }
    {
        using integer_type = signed long long int;
        auto value = std::numeric_limits<integer_type>::lowest();
        std::ostringstream stream;
        stream.precision(std::numeric_limits<integer_type>::max_digits10);
        stream << value;
        auto input = stream.str();
        decoder_type decoder(input.data(), input.size());
        TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::integer);
        TRIAL_PROTOCOL_TEST_EQUAL(decoder.signed_value<integer_type>(), value);
        decoder.next();
        TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
    }
}